

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O1

bool __thiscall
CServerBrowserFavorites::RemoveFavoriteEx
          (CServerBrowserFavorites *this,char *pHostname,NETADDR *pAddr)

{
  int iVar1;
  CServerBrowserFavorites *b;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  int Index;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  if (0 < this->m_NumFavoriteServers) {
    lVar3 = 0;
    b = this;
    do {
      iVar1 = str_comp(pHostname,(char *)b);
      if (iVar1 == 0) {
        local_3c = (uint)lVar3;
        goto LAB_0012d36f;
      }
      lVar3 = lVar3 + 1;
      b = (CServerBrowserFavorites *)(b->m_aFavoriteServers + 1);
    } while (lVar3 < this->m_NumFavoriteServers);
  }
  b = (CServerBrowserFavorites *)0x0;
LAB_0012d36f:
  if (pAddr != (NETADDR *)0x0 && b == (CServerBrowserFavorites *)0x0) {
    b = (CServerBrowserFavorites *)FindFavoriteByAddr(this,pAddr,(int *)&local_3c);
  }
  if (b == (CServerBrowserFavorites *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = b->m_aFavoriteServers[0].m_State;
    bVar2 = true;
    if (iVar1 < 3) {
      if ((iVar1 != 2) && ((this->m_FavLookup).m_FavoriteIndex == local_3c)) {
        (this->m_FavLookup).m_FavoriteIndex = -1;
      }
      bVar2 = false;
    }
    mem_move(this->m_aFavoriteServers + (int)local_3c,this->m_aFavoriteServers + (int)local_3c + 1,
             (~local_3c + this->m_NumFavoriteServers) * 0xbc);
    this->m_NumFavoriteServers = this->m_NumFavoriteServers + -1;
    iVar1 = (this->m_FavLookup).m_FavoriteIndex;
    if ((int)local_3c < iVar1) {
      (this->m_FavLookup).m_FavoriteIndex = iVar1 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CServerBrowserFavorites::RemoveFavoriteEx(const char *pHostname, const NETADDR *pAddr)
{
	bool Result = false;

	// find favorite entry
	int Index = 0;
	CFavoriteServer *pFavEntry = FindFavoriteByHostname(pHostname, &Index);
	if(pFavEntry == 0 && pAddr)
		pFavEntry = FindFavoriteByAddr(*pAddr, &Index);
	if(pFavEntry)
	{
		if(pFavEntry->m_State >= FAVSTATE_ADDR)
		{
			// invalidate favorite state for server entry
			Result = true;
		}
		else if(pFavEntry->m_State <= FAVSTATE_LOOKUPCHECK && m_FavLookup.m_FavoriteIndex == Index)
		{
			// skip result on favorite hostname lookup
			m_FavLookup.m_FavoriteIndex = -1;
		}

		// remove favorite
		RemoveFavoriteEntry(Index);
		if(m_FavLookup.m_FavoriteIndex > Index)
			--m_FavLookup.m_FavoriteIndex;
	}

	return Result;
}